

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

uncertain_measurement units::root(uncertain_measurement *um,int power)

{
  float fVar1;
  float fVar2;
  int iVar3;
  double dVar4;
  uncertain_measurement uVar5;
  unit local_18;
  
  dVar4 = numericalRoot<double>((double)um->value_,power);
  fVar1 = um->uncertainty_;
  iVar3 = -power;
  if (0 < power) {
    iVar3 = power;
  }
  fVar2 = um->value_;
  local_18 = um->units_;
  uVar5.units_ = root(&local_18,power);
  uVar5.value_ = (float)dVar4;
  uVar5.uncertainty_ = (float)(((double)fVar1 * dVar4) / ((double)fVar2 * (double)iVar3));
  return uVar5;
}

Assistant:

uncertain_measurement root(const uncertain_measurement& um, int power)
{
    auto new_value = numericalRoot(um.value(), power);
    auto new_tol = new_value * um.uncertainty() /
        (static_cast<double>((power >= 0) ? power : -power) * um.value());
    return uncertain_measurement(new_value, new_tol, root(um.units(), power));
}